

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialManager.cpp
# Opt level: O0

bool __thiscall
MT32Emu::PartialManager::abortFirstPolyPreferHeldWhereReserveExceeded
          (PartialManager *this,int minPart)

{
  bool bVar1;
  uint uVar2;
  int local_34;
  int local_20;
  int usePartNum;
  int partNum;
  int minPart_local;
  PartialManager *this_local;
  
  usePartNum = minPart;
  if (minPart == 8) {
    usePartNum = -1;
  }
  local_20 = 7;
  while( true ) {
    if (local_20 < usePartNum) {
      return false;
    }
    if (local_20 == -1) {
      local_34 = 8;
    }
    else {
      local_34 = local_20;
    }
    uVar2 = Part::getActivePartialCount(this->parts[local_34]);
    if ((this->numReservedPartialsForPart[local_34] < uVar2) &&
       (bVar1 = Part::abortFirstPolyPreferHeld(this->parts[local_34]), bVar1)) break;
    local_20 = local_20 + -1;
  }
  return true;
}

Assistant:

bool PartialManager::abortFirstPolyPreferHeldWhereReserveExceeded(int minPart) {
	if (minPart == 8) {
		// Rhythm is highest priority
		minPart = -1;
	}
	for (int partNum = 7; partNum >= minPart; partNum--) {
		int usePartNum = partNum == -1 ? 8 : partNum;
		if (parts[usePartNum]->getActivePartialCount() > numReservedPartialsForPart[usePartNum]) {
			// This part has exceeded its reserved partial count.
			// If it has any polys, kill its first (preferably held) one and we're done.
			if (parts[usePartNum]->abortFirstPolyPreferHeld()) {
				return true;
			}
		}
	}
	return false;
}